

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_storage.cpp
# Opt level: O2

bool __thiscall
miniros::master::ParameterStorage::hasParam(ParameterStorage *this,string *caller_id,string *key)

{
  pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*> pVar1;
  string fullKey;
  Path fullPath;
  string local_80;
  Path local_60;
  
  names::resolve(&local_80,caller_id,key,false);
  names::Path::Path(&local_60);
  names::Path::fromString(&local_60,&local_80);
  ::std::mutex::lock(&this->m_parameterLock);
  pVar1 = findParameter(this,&local_60,false);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_parameterLock);
  names::Path::~Path(&local_60);
  ::std::__cxx11::string::~string((string *)&local_80);
  return pVar1.first != (XmlRpcValue *)0x0;
}

Assistant:

bool ParameterStorage::hasParam(const std::string& caller_id, const std::string& key) const
{
  std::string fullKey = miniros::names::resolve(caller_id, key, false);
  names::Path fullPath;
  fullPath.fromString(fullKey);

  std::scoped_lock<std::mutex> lock(m_parameterLock);
  RpcValue* param = this->findParameter(fullPath, false).first;
  return param != nullptr;
}